

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Utils.c
# Opt level: O0

int XCountUtf8Char(uchar *buf,int len)

{
  int local_20;
  int local_1c;
  int cl;
  int nbc;
  int i;
  int len_local;
  uchar *buf_local;
  
  local_1c = 0;
  for (cl = 0; cl < len; cl = local_20 + cl) {
    local_20 = XUtf8CharByteLen(buf + cl,len - cl);
    if (local_20 < 1) {
      local_20 = 1;
    }
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

int 
XCountUtf8Char(const unsigned char 	*buf, 
	       int 			len) {

  int i = 0;
  int nbc = 0;
  while (i < len) {
    int cl = XUtf8CharByteLen(buf + i, len - i);
    if (cl < 1) cl = 1;
    nbc++;
    i += cl;
  }
  return nbc;
}